

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_node.h
# Opt level: O2

void __thiscall compose::TreeNode::~TreeNode(TreeNode *this)

{
  (this->super_INode)._vptr_INode = (_func_int **)&PTR_AddNode_00136888;
  std::vector<std::shared_ptr<compose::INode>,_std::allocator<std::shared_ptr<compose::INode>_>_>::
  ~vector(&this->nodes_);
  LeafNode::~LeafNode((LeafNode *)this);
  return;
}

Assistant:

TreeNode::~TreeNode() {}